

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int HistogramAddEval(VP8LHistogram *a,VP8LHistogram *b,VP8LHistogram *out,int64_t cost_threshold)

{
  int iVar1;
  VP8LHistogram *in_RCX;
  VP8LHistogram *in_RDX;
  long in_RSI;
  uint64_t *in_RDI;
  uint64_t sum_cost;
  uint64_t cost;
  VP8LHistogram *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  SaturateAdd(in_RDI[0x196] + *(long *)(in_RSI + 0xcb0),(int64_t *)&stack0xffffffffffffffd8);
  iVar1 = GetCombinedHistogramEntropy
                    ((VP8LHistogram *)cost,(VP8LHistogram *)sum_cost,
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (iVar1 != 0) {
    HistogramAdd(in_RDX,in_RCX,in_stack_ffffffffffffffd0);
    in_RDX->bit_cost_ = (uint64_t)in_stack_ffffffffffffffd0;
    in_RDX->palette_code_bits_ = (int)in_RDI[0x195];
  }
  return (uint)(iVar1 != 0);
}

Assistant:

WEBP_NODISCARD static int HistogramAddEval(const VP8LHistogram* const a,
                                           const VP8LHistogram* const b,
                                           VP8LHistogram* const out,
                                           int64_t cost_threshold) {
  uint64_t cost;
  const uint64_t sum_cost = a->bit_cost_ + b->bit_cost_;
  SaturateAdd(sum_cost, &cost_threshold);
  if (!GetCombinedHistogramEntropy(a, b, cost_threshold, &cost)) return 0;

  HistogramAdd(a, b, out);
  out->bit_cost_ = cost;
  out->palette_code_bits_ = a->palette_code_bits_;
  return 1;
}